

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  stbi_uc sVar9;
  byte *pbVar10;
  byte *pbVar11;
  stbi_uc *psVar12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  long in_FS_OFFSET;
  stbi_uc local_a08 [31];
  byte bStack_9e9;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_00108f17:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_length;
    do {
      uVar2 = stbi__zreceive(a,1);
      uVar3 = stbi__zreceive(a,2);
      if (uVar3 == 0) {
        uVar3 = a->num_bits;
        if ((uVar3 & 7) != 0) {
          stbi__zreceive(a,uVar3 & 7);
          uVar3 = a->num_bits;
        }
        uVar16 = 0;
        while (0 < (int)uVar3) {
          uVar4 = a->code_buffer;
          *(char *)((long)z_codelength.fast + uVar16) = (char)uVar4;
          uVar16 = uVar16 + 1;
          a->code_buffer = uVar4 >> 8;
          uVar3 = uVar3 - 8;
          a->num_bits = uVar3;
        }
        if ((int)uVar3 < 0) {
LAB_001093e1:
          pcVar13 = "zlib corrupt";
LAB_001093f5:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar13;
          goto LAB_001093fe;
        }
        for (; uVar16 < 4; uVar16 = uVar16 + 1) {
          psVar12 = a->zbuffer;
          if (psVar12 < a->zbuffer_end) {
            a->zbuffer = psVar12 + 1;
            sVar9 = *psVar12;
          }
          else {
            sVar9 = '\0';
          }
          *(stbi_uc *)((long)z_codelength.fast + uVar16) = sVar9;
        }
        if ((z_codelength.fast[1] ^ z_codelength.fast[0]) != 0xffff) goto LAB_001093e1;
        psVar12 = a->zbuffer;
        uVar16 = (ulong)z_codelength.fast[0];
        if (a->zbuffer_end < psVar12 + uVar16) {
          pcVar13 = "read past buffer";
          goto LAB_001093f5;
        }
        pcVar13 = a->zout;
        if (a->zout_end < pcVar13 + uVar16) {
          iVar7 = stbi__zexpand(a,pcVar13,(uint)z_codelength.fast[0]);
          if (iVar7 == 0) goto LAB_001093fe;
          psVar12 = a->zbuffer;
          pcVar13 = a->zout;
        }
        memcpy(pcVar13,psVar12,uVar16);
        a->zbuffer = a->zbuffer + uVar16;
        a->zout = a->zout + uVar16;
      }
      else {
        if (uVar3 == 1) {
          iVar7 = stbi__zbuild_huffman
                            (z,
                             "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                             ,0x120);
          if (iVar7 == 0) goto LAB_001093fe;
          psVar12 = 
          "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
          ;
          iVar7 = 0x20;
        }
        else {
          if (uVar3 == 3) goto LAB_001093fe;
          uVar4 = stbi__zreceive(a,5);
          uVar5 = stbi__zreceive(a,5);
          uVar6 = stbi__zreceive(a,4);
          local_a08[0] = '\0';
          local_a08[1] = '\0';
          local_a08[2] = '\0';
          local_a08[3] = '\0';
          local_a08[4] = '\0';
          local_a08[5] = '\0';
          local_a08[6] = '\0';
          local_a08[7] = '\0';
          local_a08[8] = '\0';
          local_a08[9] = '\0';
          local_a08[10] = '\0';
          local_a08[0xb] = '\0';
          local_a08[0xc] = '\0';
          local_a08[0xd] = '\0';
          local_a08[0xe] = '\0';
          local_a08[0xf] = '\0';
          local_a08[0x10] = '\0';
          local_a08[0x11] = '\0';
          local_a08[0x12] = '\0';
          uVar3 = uVar6 + 4;
          if ((int)(uVar6 + 4) < 1) {
            uVar3 = 0;
          }
          for (uVar16 = 0; uVar3 != uVar16; uVar16 = uVar16 + 1) {
            uVar6 = stbi__zreceive(a,3);
            local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar16]] =
                 (stbi_uc)uVar6;
          }
          iVar7 = stbi__zbuild_huffman(&z_codelength,local_a08,0x13);
          if (iVar7 == 0) goto LAB_001093fe;
          iVar7 = uVar5 + 1;
          iVar17 = uVar5 + uVar4 + 0x102;
          iVar15 = 0;
          while( true ) {
            if (iVar17 <= iVar15) break;
            uVar3 = stbi__zhuffman_decode(a,&z_codelength);
            if (0x12 < uVar3) goto LAB_001093b4;
            if (uVar3 < 0x10) {
              lencodes[iVar15] = (stbi_uc)uVar3;
              iVar15 = iVar15 + 1;
            }
            else {
              if (uVar3 == 0x11) {
                uVar3 = stbi__zreceive(a,3);
                iVar14 = uVar3 + 3;
LAB_001090dc:
                uVar3 = 0;
              }
              else {
                if (uVar3 != 0x10) {
                  uVar3 = stbi__zreceive(a,7);
                  iVar14 = uVar3 + 0xb;
                  goto LAB_001090dc;
                }
                uVar3 = stbi__zreceive(a,2);
                if (iVar15 == 0) goto LAB_001093b4;
                iVar14 = uVar3 + 3;
                uVar3 = (uint)lencodes[(long)iVar15 + -1];
              }
              if (iVar17 - iVar15 < iVar14) goto LAB_001093b4;
              memset(lencodes + iVar15,uVar3,(long)iVar14);
              iVar15 = iVar15 + iVar14;
            }
          }
          if (iVar17 != iVar15) {
LAB_001093b4:
            pcVar13 = "bad codelengths";
            goto LAB_001093f5;
          }
          iVar15 = stbi__zbuild_huffman(z,lencodes,uVar4 + 0x101);
          if (iVar15 == 0) goto LAB_001093fe;
          psVar12 = lencodes + (int)(uVar4 + 0x101);
        }
        iVar7 = stbi__zbuild_huffman(&a->z_distance,psVar12,iVar7);
        if (iVar7 == 0) goto LAB_001093fe;
        pcVar13 = a->zout;
LAB_00109230:
        while (uVar3 = stbi__zhuffman_decode(a,z), (int)uVar3 < 0x100) {
          if ((int)uVar3 < 0) goto LAB_001093ab;
          if (a->zout_end <= pcVar13) {
            iVar7 = stbi__zexpand(a,pcVar13,1);
            if (iVar7 == 0) goto LAB_001093fe;
            pcVar13 = a->zout;
          }
          *pcVar13 = (char)uVar3;
          pcVar13 = pcVar13 + 1;
        }
        if (uVar3 != 0x100) {
          if (uVar3 < 0x11e) {
            uVar16 = (ulong)(uVar3 - 0x101);
            uVar3 = stbi__zlength_base[uVar16];
            if (0xffffffffffffffeb < uVar16 - 0x1c) {
              uVar4 = stbi__zreceive(a,stbi__zlength_extra[uVar16]);
              uVar3 = uVar3 + uVar4;
            }
            uVar4 = stbi__zhuffman_decode(a,&a->z_distance);
            if (uVar4 < 0x1e) {
              iVar7 = stbi__zdist_base[uVar4];
              if (3 < uVar4) {
                uVar4 = stbi__zreceive(a,stbi__zdist_extra[uVar4]);
                iVar7 = iVar7 + uVar4;
              }
              if ((long)pcVar13 - (long)a->zout_start < (long)iVar7) {
                pcVar13 = "bad dist";
                goto LAB_001093f5;
              }
              if (a->zout_end < pcVar13 + (int)uVar3) {
                iVar15 = stbi__zexpand(a,pcVar13,uVar3);
                if (iVar15 == 0) goto LAB_001093fe;
                pcVar13 = a->zout;
              }
              lVar8 = -(long)iVar7;
              if (iVar7 == 1) {
                if (uVar3 != 0) {
                  memset(pcVar13,(uint)(byte)pcVar13[lVar8],(ulong)uVar3);
                  pcVar13 = pcVar13 + (ulong)(uVar3 - 1) + 1;
                }
              }
              else {
                for (; uVar3 != 0; uVar3 = uVar3 - 1) {
                  *pcVar13 = pcVar13[lVar8];
                  pcVar13 = pcVar13 + 1;
                }
              }
              goto LAB_00109230;
            }
          }
LAB_001093ab:
          pcVar13 = "bad huffman code";
          goto LAB_001093f5;
        }
        a->zout = pcVar13;
      }
      iVar7 = 1;
    } while (uVar2 == 0);
  }
  else {
    pbVar10 = a->zbuffer;
    pbVar1 = a->zbuffer_end;
    uVar2 = 0;
    if (pbVar10 < pbVar1) {
      a->zbuffer = pbVar10 + 1;
      uVar3 = (uint)*pbVar10;
      pbVar10 = pbVar10 + 1;
    }
    else {
      uVar3 = 0;
    }
    pbVar11 = pbVar10;
    if (pbVar10 < pbVar1) {
      pbVar11 = pbVar10 + 1;
      a->zbuffer = pbVar11;
      uVar2 = (uint)*pbVar10;
    }
    pcVar13 = "bad zlib header";
    if ((pbVar11 < pbVar1) && ((short)((uVar3 << 8 | uVar2) % 0x1f) == 0)) {
      if ((uVar2 & 0x20) == 0) {
        if ((uVar3 & 0xf) == 8) goto LAB_00108f17;
        pcVar13 = "bad compression";
      }
      else {
        pcVar13 = "no preset dict";
      }
    }
    *(char **)(in_FS_OFFSET + -0x20) = pcVar13;
LAB_001093fe:
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}